

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

void improve_attack_modifier
               (player *p,object *obj,monster_conflict *mon,int *brand_used,int *slay_used,
               char *verb,_Bool range)

{
  _Bool _Var1;
  wchar_t wVar2;
  int *piVar3;
  ulong uVar4;
  brand_conflict *pbVar5;
  slay_conflict *slay;
  ulong uVar6;
  bool bVar7;
  wchar_t local_64;
  int *local_60;
  
  if ((long)*brand_used == 0) {
    if ((long)*slay_used == 0) {
      local_64 = L'\x01';
    }
    else {
      local_64 = L'\x01';
      if (L'\x01' < slays[*slay_used].multiplier) {
        local_64 = slays[*slay_used].multiplier;
      }
    }
  }
  else {
    pbVar5 = brands + *brand_used;
    wVar2 = get_monster_brand_multiplier(mon,pbVar5);
    local_64 = L'\x01';
    if (L'\x01' < wVar2) {
      local_64 = get_monster_brand_multiplier(mon,pbVar5);
    }
  }
  if (1 < z_info->brand_max) {
    uVar6 = 1;
    local_60 = &timed_effects[0].temp_brand;
    do {
      pbVar5 = brands + uVar6;
      if (obj == (object *)0x0) {
        bVar7 = true;
        uVar4 = 0;
        piVar3 = local_60;
        do {
          if ((uVar6 == (uint)*piVar3) && (p->timed[uVar4] != 0)) break;
          bVar7 = uVar4 < 0x34;
          uVar4 = uVar4 + 1;
          piVar3 = piVar3 + 0x1e;
        } while (uVar4 != 0x35);
        if (bVar7) goto LAB_001acfaa;
      }
      else if ((obj->brands != (_Bool *)0x0) && (obj->brands[uVar6] != false)) {
LAB_001acfaa:
        _Var1 = flag_has_dbg(mon->race->flags,0xc,pbVar5->resist_flag,"mon->race->flags",
                             "b->resist_flag");
        if ((!_Var1) && (wVar2 = get_monster_brand_multiplier(mon,pbVar5), local_64 < wVar2)) {
          *brand_used = (int)uVar6;
          my_strcpy(verb,pbVar5->verb,0x14);
          local_64 = wVar2;
          if (range) {
            my_strcat(verb,"s",0x14);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < z_info->brand_max);
  }
  if (1 < z_info->slay_max) {
    uVar6 = 1;
    local_60 = &timed_effects[0].temp_slay;
    do {
      slay = slays + uVar6;
      if (obj == (object *)0x0) {
        bVar7 = true;
        uVar4 = 0;
        piVar3 = local_60;
        do {
          if ((uVar6 == (uint)*piVar3) && (p->timed[uVar4] != 0)) break;
          bVar7 = uVar4 < 0x34;
          uVar4 = uVar4 + 1;
          piVar3 = piVar3 + 0x1e;
        } while (uVar4 != 0x35);
        if (bVar7) goto LAB_001ad0d0;
      }
      else if ((obj->slays != (_Bool *)0x0) && (obj->slays[uVar6] != false)) {
LAB_001ad0d0:
        _Var1 = react_to_specific_slay(slay,mon);
        if ((_Var1) && (wVar2 = slay->multiplier, local_64 < wVar2)) {
          *brand_used = 0;
          *slay_used = (int)uVar6;
          my_strcpy(verb,(&slay->melee_verb)[range],0x14);
          local_64 = wVar2;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < z_info->slay_max);
  }
  return;
}

Assistant:

void improve_attack_modifier(struct player *p, struct object *obj,
	const struct monster *mon, int *brand_used, int *slay_used,
	char *verb, bool range)
{
	int i, best_mult = 1;

	/* Set the current best multiplier */
	if (*brand_used) {
		struct brand *b = &brands[*brand_used];
		best_mult = MAX(best_mult,
			get_monster_brand_multiplier(mon, b));
	} else if (*slay_used) {
		struct slay *s = &slays[*slay_used];
		best_mult = MAX(best_mult, s->multiplier);
	}

	/* Brands */
	for (i = 1; i < z_info->brand_max; i++) {
		struct brand *b = &brands[i];
		if (obj) {
			/* Brand is on an object */
			if (!obj->brands || !obj->brands[i]) continue;
		} else {
			/* Temporary brand */
			if (!player_has_temporary_brand(p, i)) continue;
		}
 
		/* Is the monster vulnerable? */
		if (!rf_has(mon->race->flags, b->resist_flag)) {
			int mult = get_monster_brand_multiplier(mon, b);

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = i;
				my_strcpy(verb, b->verb, 20);
				if (range)
					my_strcat(verb, "s", 20);
			}
		}
	}

	/* Slays */
	for (i = 1; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj) {
			/* Slay is on an object */
			if (!obj->slays || !obj->slays[i]) continue;
		} else {
			/* Temporary slay */
			if (!player_has_temporary_slay(p, i)) continue;
		}
 
		/* Is the monster is vulnerable? */
		if (react_to_specific_slay(s, mon)) {
			int mult = s->multiplier;

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = 0;
				*slay_used = i;
				if (range) {
					my_strcpy(verb, s->range_verb, 20);
				} else {
					my_strcpy(verb, s->melee_verb, 20);
				}
			}
		}
	}
}